

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack13_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  uVar1 = *in;
  *out = uVar1 & 0x1fff;
  out[1] = uVar1 >> 0xd & 0x1fff;
  out[2] = uVar1 >> 0x1a;
  uVar2 = in[1];
  out[2] = uVar1 >> 0x1a | (uVar2 & 0x7f) << 6;
  out[3] = uVar2 >> 7 & 0x1fff;
  out[4] = uVar2 >> 0x14;
  uVar1 = in[2];
  out[4] = uVar2 >> 0x14 | (uVar1 & 1) << 0xc;
  auVar4 = vpbroadcastd_avx512vl();
  auVar4 = vpsrlvd_avx2(auVar4,_DAT_001a9010);
  auVar3._8_4_ = 0x1fff;
  auVar3._0_8_ = 0x1fff00001fff;
  auVar3._12_4_ = 0x1fff;
  auVar4 = vpandd_avx512vl(auVar4,auVar3);
  *(long *)(out + 5) = auVar4._0_8_;
  uVar2 = in[3];
  out[7] = uVar1 >> 0x1b;
  out[7] = (uVar2 & 0xff) << 5 | uVar1 >> 0x1b;
  return in + 4;
}

Assistant:

const uint32_t *__fastunpack13_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 13);
  out++;
  *out = ((*in) >> 13) % (1U << 13);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 7)) << (13 - 7);
  out++;
  *out = ((*in) >> 7) % (1U << 13);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 1)) << (13 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 13);
  out++;
  *out = ((*in) >> 14) % (1U << 13);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 8)) << (13 - 8);
  out++;

  return in + 1;
}